

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restaurant.cpp
# Opt level: O0

void __thiscall Restaurant::Restaurant(Restaurant *this,Restaurant *other)

{
  bool bVar1;
  int iVar2;
  vector<Table_*,_std::allocator<Table_*>_> *this_00;
  reference ppTVar3;
  Table *this_01;
  vector<BaseAction_*,_std::allocator<BaseAction_*>_> *this_02;
  reference ppBVar4;
  undefined4 extraout_var;
  value_type local_78;
  BaseAction *local_70;
  BaseAction *j;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<BaseAction_*,_std::allocator<BaseAction_*>_> *__range1_1;
  Table *tempTable;
  Table *table;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Table_*,_std::allocator<Table_*>_> *__range1;
  Restaurant *local_18;
  Restaurant *other_local;
  Restaurant *this_local;
  
  this->_vptr_Restaurant = (_func_int **)&PTR__Restaurant_00120d80;
  this->open = (bool)(other->open & 1);
  this->nextCustomerId = other->nextCustomerId;
  (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18 = other;
  other_local = this;
  std::vector<Table_*,_std::allocator<Table_*>_>::vector(&this->tables);
  std::vector<Dish,_std::allocator<Dish>_>::vector(&this->menu,&local_18->menu);
  (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>::vector(&this->actionsLog);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->newMsg,"",(allocator *)((long)&__range1 + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 3));
  this_00 = &local_18->tables;
  __end1 = std::vector<Table_*,_std::allocator<Table_*>_>::begin(this_00);
  table = (Table *)std::vector<Table_*,_std::allocator<Table_*>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Table_*const_*,_std::vector<Table_*,_std::allocator<Table_*>_>_>
                                *)&table);
    if (!bVar1) break;
    ppTVar3 = __gnu_cxx::
              __normal_iterator<Table_*const_*,_std::vector<Table_*,_std::allocator<Table_*>_>_>::
              operator*(&__end1);
    tempTable = *ppTVar3;
    this_01 = (Table *)operator_new(0x40);
    Table::Table(this_01,tempTable);
    __range1_1 = (vector<BaseAction_*,_std::allocator<BaseAction_*>_> *)this_01;
    std::vector<Table_*,_std::allocator<Table_*>_>::push_back
              (&this->tables,(value_type *)&__range1_1);
    __gnu_cxx::__normal_iterator<Table_*const_*,_std::vector<Table_*,_std::allocator<Table_*>_>_>::
    operator++(&__end1);
  }
  this_02 = &local_18->actionsLog;
  __end1_1 = std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>::begin(this_02);
  j = (BaseAction *)std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>::end(this_02);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<BaseAction_*const_*,_std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>_>
                        *)&j);
    if (!bVar1) break;
    ppBVar4 = __gnu_cxx::
              __normal_iterator<BaseAction_*const_*,_std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>_>
              ::operator*(&__end1_1);
    local_70 = *ppBVar4;
    iVar2 = (*local_70->_vptr_BaseAction[2])();
    local_78 = (value_type)CONCAT44(extraout_var,iVar2);
    std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>::push_back(&this->actionsLog,&local_78)
    ;
    __gnu_cxx::
    __normal_iterator<BaseAction_*const_*,_std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>_>
    ::operator++(&__end1_1);
  }
  return;
}

Assistant:

Restaurant::Restaurant(const Restaurant &other) :open(other.open), nextCustomerId(other.nextCustomerId),  tables(), menu(other.menu), actionsLog(), newMsg("")
{
    for (auto table : other.tables) {
        auto * tempTable = new Table(*table);
        tables.push_back(tempTable);
    }
    for (auto j : other.actionsLog) {
        actionsLog.push_back(j->clone());
    }
}